

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::avgrUInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  Literal *other_local;
  Literal *this_local;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  Literal(__return_storage_ptr__,(iVar1 + iVar2 + 1) / 2);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::avgrUInt(const Literal& other) const {
  return Literal((geti32() + other.geti32() + 1) / 2);
}